

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O1

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  long lVar2;
  QArrayData *pQVar3;
  int *piVar4;
  QArrayData *pQVar5;
  QArrayData *pQVar6;
  char16_t *pcVar7;
  XmlOutput *pXVar8;
  int iVar9;
  undefined4 in_register_00000034;
  xml_output *__return_storage_ptr__;
  int iVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  xml_output local_ee0;
  xml_output local_ea8;
  xml_output local_e70;
  xml_output local_e38;
  xml_output local_e00;
  xml_output local_dc8;
  xml_output local_d90;
  xml_output local_d58;
  xml_output local_d20;
  xml_output local_ce8;
  xml_output local_cb0;
  xml_output local_c78;
  xml_output local_c40;
  xml_output local_c08;
  xml_output local_bd0;
  xml_output local_b98;
  xml_output local_b60;
  xml_output local_b28;
  xml_output local_af0;
  xml_output local_ab8;
  xml_output local_a80;
  xml_output local_a48;
  xml_output local_a10;
  xml_output local_9d8;
  xml_output local_9a0;
  xml_output local_968;
  xml_output local_930;
  xml_output local_8f8;
  xml_output local_8c0;
  xml_output local_888;
  xml_output local_850;
  xml_output local_818;
  xml_output local_7e0;
  xml_output local_7a8;
  xml_output local_770;
  xml_output local_738;
  xml_output local_700;
  xml_output local_6c8;
  xml_output local_690;
  xml_output local_658;
  xml_output local_620;
  xml_output local_5e8;
  xml_output local_5b0;
  xml_output local_578;
  xml_output local_540;
  xml_output local_508;
  xml_output local_4d0;
  xml_output local_498;
  xml_output local_460;
  xml_output local_428;
  xml_output local_3f0;
  xml_output local_3b8;
  xml_output local_380;
  xml_output local_348;
  xml_output local_310;
  xml_output local_2d8;
  xml_output local_2a0;
  xml_output local_268;
  xml_output local_230;
  xml_output local_1f8;
  xml_output local_1c0;
  xml_output local_188;
  xml_output local_150;
  xml_output local_118;
  xml_output local_e0;
  xml_output local_a8;
  xml_output local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar11.m_data = (storage_type *)0x4;
  QVar11.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar11);
  local_70.xo_text.d.size = (qsizetype)local_70.xo_text.d.ptr;
  pQVar6 = (QArrayData *)CONCAT44(local_70._4_4_,local_70.xo_type);
  local_70.xo_type = tTag;
  local_70.xo_text.d.ptr = (char16_t *)local_70.xo_text.d.d;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70.xo_value.d.d = (Data *)0x0;
  local_70.xo_value.d.ptr = (char16_t *)0x0;
  local_70.xo_value.d.size = 0;
  local_70.xo_text.d.d = (Data *)pQVar6;
  pXVar8 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_70);
  QVar12.m_data = (storage_type *)0x10;
  QVar12.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar12);
  local_a8.xo_value.d.size = (qsizetype)local_a8.xo_text.d.ptr;
  local_a8.xo_value.d.ptr = (char16_t *)local_a8.xo_text.d.d;
  pQVar5 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8.xo_type);
  if (local_a8.xo_text.d.ptr == (char16_t *)0x0) {
    local_a8.xo_type = tNothing;
    local_a8.xo_text.d.d = (Data *)0x0;
    local_a8.xo_text.d.ptr = (char16_t *)0x0;
    local_a8.xo_text.d.size = 0;
    local_a8.xo_value.d.d = (Data *)0x0;
    local_a8.xo_value.d.ptr = (char16_t *)0x0;
    local_a8.xo_value.d.size = 0;
  }
  else {
    QVar13.m_data = (storage_type *)0x4;
    QVar13.m_size = (qsizetype)&local_a8;
    QString::fromUtf8(QVar13);
    local_a8.xo_text.d.size = (qsizetype)local_a8.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_a8._4_4_,local_a8.xo_type);
    local_a8.xo_type = tAttribute;
    local_a8.xo_text.d.ptr = (char16_t *)local_a8.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a8.xo_text.d.d = (Data *)pQVar3;
    local_a8.xo_value.d.d = (Data *)pQVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_a8);
  attrX(&local_e0,"AdditionalIncludeDirectories",(QStringList *)((long)__buf + 8),",");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_e0);
  attrX(&local_118,"AdditionalOptions",(QStringList *)((long)__buf + 0x20)," ");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_118);
  attrX(&local_150,"AdditionalUsingDirectories",(QStringList *)((long)__buf + 0x38),",");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_150);
  if (*(long *)((long)__buf + 0x60) == 0) {
    local_188.xo_type = tNothing;
    local_188.xo_text.d.d = (Data *)0x0;
    local_188.xo_text.d.ptr = (char16_t *)0x0;
    local_188.xo_text.d.size = 0;
    local_188.xo_value.d.d = (Data *)0x0;
    local_188.xo_value.d.ptr = (char16_t *)0x0;
    local_188.xo_value.d.size = 0;
  }
  else {
    QVar14.m_data = (storage_type *)0x18;
    QVar14.m_size = (qsizetype)&local_188;
    QString::fromUtf8(QVar14);
    local_188.xo_text.d.size = (qsizetype)local_188.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_188._4_4_,local_188.xo_type);
    local_188.xo_type = tAttribute;
    local_188.xo_text.d.ptr = (char16_t *)local_188.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_188.xo_value.d.d = *(Data **)((long)__buf + 0x50);
    local_188.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x58);
    local_188.xo_value.d.size = *(qsizetype *)((long)__buf + 0x60);
    if (&(local_188.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_188.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_188);
  iVar1 = *(int *)((long)__buf + 0x68);
  if (iVar1 == 0) {
    local_1c0.xo_type = tNothing;
    local_1c0.xo_text.d.d = (Data *)0x0;
    local_1c0.xo_text.d.ptr = (char16_t *)0x0;
    local_1c0.xo_text.d.size = 0;
    local_1c0.xo_value.d.d = (Data *)0x0;
    local_1c0.xo_value.d.ptr = (char16_t *)0x0;
    local_1c0.xo_value.d.size = 0;
  }
  else {
    QVar15.m_data = (storage_type *)0xf;
    QVar15.m_size = (qsizetype)&local_1c0;
    QString::fromUtf8(QVar15);
    pcVar7 = local_1c0.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_1c0._4_4_,local_1c0.xo_type);
    QString::number((int)&local_1f8,iVar1);
    local_1c0.xo_type = tAttribute;
    local_1c0.xo_text.d.ptr = (char16_t *)local_1c0.xo_text.d.d;
    local_1c0.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1c0.xo_value.d.d = (Data *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type);
    local_1c0.xo_value.d.ptr = (char16_t *)local_1f8.xo_text.d.d;
    local_1c0.xo_value.d.size = (qsizetype)local_1f8.xo_text.d.ptr;
    if ((QArrayData *)local_1c0.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_1c0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_1c0.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type);
    local_1c0.xo_text.d.d = (Data *)pQVar3;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type),2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_1c0);
  iVar1 = *(int *)((long)__buf + 0x6c);
  if (iVar1 == 0) {
    local_1f8.xo_type = tNothing;
    local_1f8.xo_text.d.d = (Data *)0x0;
    local_1f8.xo_text.d.ptr = (char16_t *)0x0;
    local_1f8.xo_text.d.size = 0;
    local_1f8.xo_value.d.d = (Data *)0x0;
    local_1f8.xo_value.d.ptr = (char16_t *)0x0;
    local_1f8.xo_value.d.size = 0;
  }
  else {
    QVar16.m_data = (storage_type *)0x12;
    QVar16.m_size = (qsizetype)&local_1f8;
    QString::fromUtf8(QVar16);
    pcVar7 = local_1f8.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_1f8._4_4_,local_1f8.xo_type);
    QString::number((int)&local_230,iVar1);
    local_1f8.xo_type = tAttribute;
    local_1f8.xo_text.d.ptr = (char16_t *)local_1f8.xo_text.d.d;
    local_1f8.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1f8.xo_value.d.d = (Data *)CONCAT44(local_230._4_4_,local_230.xo_type);
    local_1f8.xo_value.d.ptr = (char16_t *)local_230.xo_text.d.d;
    local_1f8.xo_value.d.size = (qsizetype)local_230.xo_text.d.ptr;
    if ((QArrayData *)local_1f8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_1f8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_1f8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_230._4_4_,local_230.xo_type);
    local_1f8.xo_text.d.d = (Data *)pQVar3;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_230._4_4_,local_230.xo_type),2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_1f8);
  iVar1 = *(int *)((long)__buf + 0x70);
  if (iVar1 == 0) {
    local_230.xo_type = tNothing;
    local_230.xo_text.d.d = (Data *)0x0;
    local_230.xo_text.d.ptr = (char16_t *)0x0;
    local_230.xo_text.d.size = 0;
    local_230.xo_value.d.d = (Data *)0x0;
    local_230.xo_value.d.ptr = (char16_t *)0x0;
    local_230.xo_value.d.size = 0;
  }
  else {
    QVar17.m_data = (storage_type *)0x11;
    QVar17.m_size = (qsizetype)&local_230;
    QString::fromUtf8(QVar17);
    pcVar7 = local_230.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_230._4_4_,local_230.xo_type);
    QString::number((int)&local_268,iVar1);
    local_230.xo_type = tAttribute;
    local_230.xo_text.d.ptr = (char16_t *)local_230.xo_text.d.d;
    local_230.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_230.xo_value.d.d = (Data *)CONCAT44(local_268._4_4_,local_268.xo_type);
    local_230.xo_value.d.ptr = (char16_t *)local_268.xo_text.d.d;
    local_230.xo_value.d.size = (qsizetype)local_268.xo_text.d.ptr;
    if ((QArrayData *)local_230.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_230.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_230.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_268._4_4_,local_268.xo_type);
    local_230.xo_text.d.d = (Data *)pQVar3;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_268._4_4_,local_268.xo_type),2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_230);
  if (*(long *)((long)__buf + 0x88) == 0) {
    local_268.xo_type = tNothing;
    local_268.xo_text.d.d = (Data *)0x0;
    local_268.xo_text.d.ptr = (char16_t *)0x0;
    local_268.xo_text.d.size = 0;
    local_268.xo_value.d.d = (Data *)0x0;
    local_268.xo_value.d.ptr = (char16_t *)0x0;
    local_268.xo_value.d.size = 0;
  }
  else {
    QVar18.m_data = (storage_type *)0x15;
    QVar18.m_size = (qsizetype)&local_268;
    QString::fromUtf8(QVar18);
    local_268.xo_text.d.size = (qsizetype)local_268.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_268._4_4_,local_268.xo_type);
    local_268.xo_type = tAttribute;
    local_268.xo_text.d.ptr = (char16_t *)local_268.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_268.xo_value.d.d = *(Data **)((long)__buf + 0x78);
    local_268.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x80);
    local_268.xo_value.d.size = *(qsizetype *)((long)__buf + 0x88);
    if (&(local_268.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_268.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_268);
  attrT(&local_2a0,"BufferSecurityCheck",*(triState *)((long)__buf + 0x90));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_2a0);
  iVar1 = *(int *)((long)__buf + 0x94);
  if (iVar1 == -1) {
    local_2d8.xo_type = tNothing;
    local_2d8.xo_text.d.d = (Data *)0x0;
    local_2d8.xo_text.d.ptr = (char16_t *)0x0;
    local_2d8.xo_text.d.size = 0;
    local_2d8.xo_value.d.d = (Data *)0x0;
    local_2d8.xo_value.d.ptr = (char16_t *)0x0;
    local_2d8.xo_value.d.size = 0;
  }
  else {
    QVar19.m_data = (storage_type *)0x11;
    QVar19.m_size = (qsizetype)&local_2d8;
    QString::fromUtf8(QVar19);
    pcVar7 = local_2d8.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_2d8._4_4_,local_2d8.xo_type);
    QString::number((int)&local_310,iVar1);
    local_2d8.xo_type = tAttribute;
    local_2d8.xo_text.d.ptr = (char16_t *)local_2d8.xo_text.d.d;
    local_2d8.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2d8.xo_value.d.d = (Data *)CONCAT44(local_310._4_4_,local_310.xo_type);
    local_2d8.xo_value.d.ptr = (char16_t *)local_310.xo_text.d.d;
    local_2d8.xo_value.d.size = (qsizetype)local_310.xo_text.d.ptr;
    if ((QArrayData *)local_2d8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_2d8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_2d8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_310._4_4_,local_310.xo_type);
    local_2d8.xo_text.d.d = (Data *)pQVar3;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_310._4_4_,local_310.xo_type),2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_2d8);
  iVar1 = *(int *)((long)__buf + 0x98);
  if (iVar1 == 0) {
    local_310.xo_type = tNothing;
    local_310.xo_text.d.d = (Data *)0x0;
    local_310.xo_text.d.ptr = (char16_t *)0x0;
    local_310.xo_text.d.size = 0;
    local_310.xo_value.d.d = (Data *)0x0;
    local_310.xo_value.d.ptr = (char16_t *)0x0;
    local_310.xo_value.d.size = 0;
  }
  else {
    QVar20.m_data = (storage_type *)0x9;
    QVar20.m_size = (qsizetype)&local_310;
    QString::fromUtf8(QVar20);
    pcVar7 = local_310.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_310._4_4_,local_310.xo_type);
    QString::number((int)&local_348,iVar1);
    local_310.xo_type = tAttribute;
    local_310.xo_text.d.ptr = (char16_t *)local_310.xo_text.d.d;
    local_310.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_310.xo_value.d.d = (Data *)CONCAT44(local_348._4_4_,local_348.xo_type);
    local_310.xo_value.d.ptr = (char16_t *)local_348.xo_text.d.d;
    local_310.xo_value.d.size = (qsizetype)local_348.xo_text.d.ptr;
    if ((QArrayData *)local_310.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_310.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_310.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_348._4_4_,local_348.xo_type);
    local_310.xo_text.d.d = (Data *)pQVar3;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_348._4_4_,local_348.xo_type),2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_310);
  iVar1 = *(int *)((long)__buf + 0x9c);
  if (iVar1 == -1) {
    local_348.xo_type = tNothing;
    local_348.xo_text.d.d = (Data *)0x0;
    local_348.xo_text.d.ptr = (char16_t *)0x0;
    local_348.xo_text.d.size = 0;
    local_348.xo_value.d.d = (Data *)0x0;
    local_348.xo_value.d.ptr = (char16_t *)0x0;
    local_348.xo_value.d.size = 0;
  }
  else {
    QVar21.m_data = (storage_type *)0x10;
    QVar21.m_size = (qsizetype)&local_348;
    QString::fromUtf8(QVar21);
    pcVar7 = local_348.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_348._4_4_,local_348.xo_type);
    QString::number((int)&local_380,iVar1);
    local_348.xo_type = tAttribute;
    local_348.xo_text.d.ptr = (char16_t *)local_348.xo_text.d.d;
    local_348.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_348.xo_value.d.d = (Data *)local_380._0_8_;
    local_348.xo_value.d.ptr = (char16_t *)local_380.xo_text.d.d;
    local_348.xo_value.d.size = (qsizetype)local_380.xo_text.d.ptr;
    local_348.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_380._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_380._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_380._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QBasicAtomicInt *)local_380._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_380._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_380._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_380._0_8_,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_348);
  attrT(&local_380,"CompileOnly",*(triState *)((long)__buf + 0xa4));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_380);
  iVar1 = *(int *)((long)__buf + 0xa8);
  if (iVar1 == -1) {
    local_3b8.xo_type = tNothing;
    local_3b8.xo_text.d.d = (Data *)0x0;
    local_3b8.xo_text.d.ptr = (char16_t *)0x0;
    local_3b8.xo_text.d.size = 0;
    local_3b8.xo_value.d.d = (Data *)0x0;
    local_3b8.xo_value.d.ptr = (char16_t *)0x0;
    local_3b8.xo_value.d.size = 0;
  }
  else {
    QVar22.m_data = (storage_type *)0x16;
    QVar22.m_size = (qsizetype)&local_3b8;
    QString::fromUtf8(QVar22);
    pcVar7 = local_3b8.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_3b8._4_4_,local_3b8.xo_type);
    QString::number((int)&local_3f0,iVar1);
    local_3b8.xo_type = tAttribute;
    local_3b8.xo_text.d.ptr = (char16_t *)local_3b8.xo_text.d.d;
    local_3b8.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_3b8.xo_value.d.d = (Data *)local_3f0._0_8_;
    local_3b8.xo_value.d.ptr = (char16_t *)local_3f0.xo_text.d.d;
    local_3b8.xo_value.d.size = (qsizetype)local_3f0.xo_text.d.ptr;
    local_3b8.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_3f0._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3f0._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3f0._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QBasicAtomicInt *)local_3f0._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3f0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3f0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_3f0._0_8_,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_3b8);
  attrT(&local_3f0,"Detect64BitPortabilityProblems",*(triState *)((long)__buf + 0xb0));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_3f0);
  attrT(&local_428,"DisableLanguageExtensions",*(triState *)((long)__buf + 0xb4));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_428);
  attrX(&local_460,"DisableSpecificWarnings",(QStringList *)((long)__buf + 0xb8),",");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_460);
  iVar1 = *(int *)((long)__buf + 0xd0);
  if (iVar1 == 0) {
    local_498.xo_type = tNothing;
    local_498.xo_text.d.d = (Data *)0x0;
    local_498.xo_text.d.ptr = (char16_t *)0x0;
    local_498.xo_text.d.size = 0;
    local_498.xo_value.d.d = (Data *)0x0;
    local_498.xo_value.d.ptr = (char16_t *)0x0;
    local_498.xo_value.d.size = 0;
  }
  else {
    QVar23.m_data = (storage_type *)0x1c;
    QVar23.m_size = (qsizetype)&local_498;
    QString::fromUtf8(QVar23);
    pcVar7 = local_498.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_498._4_4_,local_498.xo_type);
    QString::number((int)&local_4d0,iVar1);
    local_498.xo_type = tAttribute;
    local_498.xo_text.d.ptr = (char16_t *)local_498.xo_text.d.d;
    local_498.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_498.xo_value.d.d = (Data *)local_4d0._0_8_;
    local_498.xo_value.d.ptr = (char16_t *)local_4d0.xo_text.d.d;
    local_498.xo_value.d.size = (qsizetype)local_4d0.xo_text.d.ptr;
    local_498.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_4d0._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4d0._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4d0._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QBasicAtomicInt *)local_4d0._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4d0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4d0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_4d0._0_8_,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_498);
  attrT(&local_4d0,"EnableFiberSafeOptimizations",*(triState *)((long)__buf + 0xd4));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_4d0);
  attrT(&local_508,"EnableFunctionLevelLinking",*(triState *)((long)__buf + 0xd8));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_508);
  attrT(&local_540,"EnableIntrinsicFunctions",*(triState *)((long)__buf + 0xdc));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_540);
  xformExceptionHandlingNET2005
            (&local_578,*(exceptionHandling *)((long)__buf + 0xe0),
             *(DotNET *)(*(long *)((long)__buf + 0x318) + 4));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_578);
  attrT(&local_5b0,"ExpandAttributedSource",*(triState *)((long)__buf + 0xe4));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_5b0);
  iVar1 = *(int *)((long)__buf + 0xe8);
  if (iVar1 == 0) {
    local_5e8.xo_type = tNothing;
    local_5e8.xo_text.d.d = (Data *)0x0;
    local_5e8.xo_text.d.ptr = (char16_t *)0x0;
    local_5e8.xo_text.d.size = 0;
    local_5e8.xo_value.d.d = (Data *)0x0;
    local_5e8.xo_value.d.ptr = (char16_t *)0x0;
    local_5e8.xo_value.d.size = 0;
  }
  else {
    QVar24.m_data = (storage_type *)0x10;
    QVar24.m_size = (qsizetype)&local_5e8;
    QString::fromUtf8(QVar24);
    pcVar7 = local_5e8.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_5e8._4_4_,local_5e8.xo_type);
    QString::number((int)&local_620,iVar1);
    local_5e8.xo_type = tAttribute;
    local_5e8.xo_text.d.ptr = (char16_t *)local_5e8.xo_text.d.d;
    local_5e8.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_5e8.xo_value.d.d = (Data *)CONCAT44(local_620._4_4_,local_620.xo_type);
    local_5e8.xo_value.d.ptr = (char16_t *)local_620.xo_text.d.d;
    local_5e8.xo_value.d.size = (qsizetype)local_620.xo_text.d.ptr;
    if ((QArrayData *)local_5e8.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_5e8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_5e8.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_620._4_4_,local_620.xo_type);
    local_5e8.xo_text.d.d = (Data *)pQVar3;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_620._4_4_,local_620.xo_type),2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_5e8);
  iVar1 = *(int *)((long)__buf + 0xec);
  if (iVar1 == -1) {
    local_620.xo_type = tNothing;
    local_620.xo_text.d.d = (Data *)0x0;
    local_620.xo_text.d.ptr = (char16_t *)0x0;
    local_620.xo_text.d.size = 0;
    local_620.xo_value.d.d = (Data *)0x0;
    local_620.xo_value.d.ptr = (char16_t *)0x0;
    local_620.xo_value.d.size = 0;
  }
  else {
    QVar25.m_data = (storage_type *)0x12;
    QVar25.m_size = (qsizetype)&local_620;
    QString::fromUtf8(QVar25);
    pcVar7 = local_620.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_620._4_4_,local_620.xo_type);
    QString::number((int)&local_658,iVar1);
    local_620.xo_type = tAttribute;
    local_620.xo_text.d.ptr = (char16_t *)local_620.xo_text.d.d;
    local_620.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_620.xo_value.d.d = (Data *)local_658._0_8_;
    local_620.xo_value.d.ptr = (char16_t *)local_658.xo_text.d.d;
    local_620.xo_value.d.size = (qsizetype)local_658.xo_text.d.ptr;
    local_620.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_658._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_658._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_658._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QBasicAtomicInt *)local_658._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_658._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_658._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_658._0_8_,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_620);
  attrT(&local_658,"FloatingPointExceptions",*(triState *)((long)__buf + 0xf0));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_658);
  attrT(&local_690,"ForceConformanceInForLoopScope",*(triState *)((long)__buf + 0xf4));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_690);
  attrX(&local_6c8,"ForcedIncludeFiles",(QStringList *)((long)__buf + 0xf8),",");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_6c8);
  attrX(&local_700,"ForcedUsingFiles",(QStringList *)((long)__buf + 0x110),",");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_700);
  iVar1 = *(int *)((long)__buf + 0x128);
  if (iVar1 == -1) {
    local_738.xo_type = tNothing;
    local_738.xo_text.d.d = (Data *)0x0;
    local_738.xo_text.d.ptr = (char16_t *)0x0;
    local_738.xo_text.d.size = 0;
    local_738.xo_value.d.d = (Data *)0x0;
    local_738.xo_value.d.ptr = (char16_t *)0x0;
    local_738.xo_value.d.size = 0;
  }
  else {
    QVar26.m_data = (storage_type *)0x18;
    QVar26.m_size = (qsizetype)&local_738;
    QString::fromUtf8(QVar26);
    pcVar7 = local_738.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_738._4_4_,local_738.xo_type);
    QString::number((int)&local_770,iVar1);
    local_738.xo_type = tAttribute;
    local_738.xo_text.d.ptr = (char16_t *)local_738.xo_text.d.d;
    local_738.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_738.xo_value.d.d = (Data *)local_770._0_8_;
    local_738.xo_value.d.ptr = (char16_t *)local_770.xo_text.d.d;
    local_738.xo_value.d.size = (qsizetype)local_770.xo_text.d.ptr;
    local_738.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_770._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_770._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_770._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QBasicAtomicInt *)local_770._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_770._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_770._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_770._0_8_,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_738);
  attrT(&local_770,"GlobalOptimizations",*(triState *)((long)__buf + 0x130));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_770);
  attrT(&local_7a8,"IgnoreStandardIncludePath",*(triState *)((long)__buf + 0x134));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_7a8);
  attrT(&local_7e0,"ImproveFloatingPointConsistency",*(triState *)((long)__buf + 0x138));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_7e0);
  iVar1 = *(int *)((long)__buf + 0x13c);
  if (iVar1 == 3) {
    local_818.xo_type = tNothing;
    local_818.xo_text.d.d = (Data *)0x0;
    local_818.xo_text.d.ptr = (char16_t *)0x0;
    local_818.xo_text.d.size = 0;
    local_818.xo_value.d.d = (Data *)0x0;
    local_818.xo_value.d.ptr = (char16_t *)0x0;
    local_818.xo_value.d.size = 0;
  }
  else {
    QVar27.m_data = (storage_type *)0x17;
    QVar27.m_size = (qsizetype)&local_818;
    QString::fromUtf8(QVar27);
    pcVar7 = local_818.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_818._4_4_,local_818.xo_type);
    QString::number((int)&local_850,iVar1);
    local_818.xo_type = tAttribute;
    local_818.xo_text.d.ptr = (char16_t *)local_818.xo_text.d.d;
    local_818.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_818.xo_value.d.d = (Data *)local_850._0_8_;
    local_818.xo_value.d.ptr = (char16_t *)local_850.xo_text.d.d;
    local_818.xo_value.d.size = (qsizetype)local_850.xo_text.d.ptr;
    local_818.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_850._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_850._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_850._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QBasicAtomicInt *)local_850._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_850._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_850._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_850._0_8_,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_818);
  attrT(&local_850,"KeepComments",*(triState *)((long)__buf + 0x140));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_850);
  attrT(&local_888,"MinimalRebuild",*(triState *)((long)__buf + 0x178));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_888);
  if (*(long *)((long)__buf + 400) == 0) {
    local_8c0.xo_type = tNothing;
    local_8c0.xo_text.d.d = (Data *)0x0;
    local_8c0.xo_text.d.ptr = (char16_t *)0x0;
    local_8c0.xo_text.d.size = 0;
    local_8c0.xo_value.d.d = (Data *)0x0;
    local_8c0.xo_value.d.ptr = (char16_t *)0x0;
    local_8c0.xo_value.d.size = 0;
  }
  else {
    QVar28.m_data = (storage_type *)0xa;
    QVar28.m_size = (qsizetype)&local_8c0;
    QString::fromUtf8(QVar28);
    local_8c0.xo_text.d.size = (qsizetype)local_8c0.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_8c0._4_4_,local_8c0.xo_type);
    local_8c0.xo_type = tAttribute;
    local_8c0.xo_text.d.ptr = (char16_t *)local_8c0.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_8c0.xo_value.d.d = *(Data **)((long)__buf + 0x180);
    local_8c0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x188);
    local_8c0.xo_value.d.size = *(qsizetype *)((long)__buf + 400);
    if (&(local_8c0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_8c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_8c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_8c0.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_8c0);
  attrT(&local_8f8,"OmitFramePointers",*(triState *)((long)__buf + 0x19c));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_8f8);
  attrT(&local_930,"OpenMP",*(triState *)((long)__buf + 0x1a0));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_930);
  iVar1 = *(int *)((long)__buf + 0x1a4);
  if (iVar1 == 5) {
    local_968.xo_type = tNothing;
    local_968.xo_text.d.d = (Data *)0x0;
    local_968.xo_text.d.ptr = (char16_t *)0x0;
    local_968.xo_text.d.size = 0;
    local_968.xo_value.d.d = (Data *)0x0;
    local_968.xo_value.d.ptr = (char16_t *)0x0;
    local_968.xo_value.d.size = 0;
  }
  else {
    QVar29.m_data = (storage_type *)0xd;
    QVar29.m_size = (qsizetype)&local_968;
    QString::fromUtf8(QVar29);
    pcVar7 = local_968.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_968._4_4_,local_968.xo_type);
    QString::number((int)&local_9a0,iVar1);
    local_968.xo_type = tAttribute;
    local_968.xo_text.d.ptr = (char16_t *)local_968.xo_text.d.d;
    local_968.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_968.xo_value.d.d = (Data *)CONCAT44(local_9a0._4_4_,local_9a0.xo_type);
    local_968.xo_value.d.ptr = (char16_t *)local_9a0.xo_text.d.d;
    local_968.xo_value.d.size = (qsizetype)local_9a0.xo_text.d.ptr;
    if ((QArrayData *)local_968.xo_value.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_968.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_968.xo_value.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_9a0._4_4_,local_9a0.xo_type);
    local_968.xo_text.d.d = (Data *)pQVar3;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_9a0._4_4_,local_9a0.xo_type),2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_968);
  iVar1 = *(int *)((long)__buf + 0x1a8);
  if (iVar1 == 0) {
    local_9a0.xo_type = tNothing;
    local_9a0.xo_text.d.d = (Data *)0x0;
    local_9a0.xo_text.d.ptr = (char16_t *)0x0;
    local_9a0.xo_text.d.size = 0;
    local_9a0.xo_value.d.d = (Data *)0x0;
    local_9a0.xo_value.d.ptr = (char16_t *)0x0;
    local_9a0.xo_value.d.size = 0;
  }
  else {
    QVar30.m_data = (storage_type *)0x14;
    QVar30.m_size = (qsizetype)&local_9a0;
    QString::fromUtf8(QVar30);
    pcVar7 = local_9a0.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_9a0._4_4_,local_9a0.xo_type);
    QString::number((int)&local_9d8,iVar1);
    local_9a0.xo_type = tAttribute;
    local_9a0.xo_text.d.ptr = (char16_t *)local_9a0.xo_text.d.d;
    local_9a0.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_9a0.xo_value.d.d = (Data *)local_9d8._0_8_;
    local_9a0.xo_value.d.ptr = (char16_t *)local_9d8.xo_text.d.d;
    local_9a0.xo_value.d.size = (qsizetype)local_9d8.xo_text.d.ptr;
    local_9a0.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_9d8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_9d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_9d8._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QBasicAtomicInt *)local_9d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_9d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_9d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_9d8._0_8_,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_9a0);
  attrT(&local_9d8,"OptimizeForWindowsApplication",*(triState *)((long)__buf + 0x1ac));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_9d8);
  if (*(long *)((long)__buf + 0x1c0) == 0) {
    local_a10.xo_type = tNothing;
    local_a10.xo_text.d.d = (Data *)0x0;
    local_a10.xo_text.d.ptr = (char16_t *)0x0;
    local_a10.xo_text.d.size = 0;
    local_a10.xo_value.d.d = (Data *)0x0;
    local_a10.xo_value.d.ptr = (char16_t *)0x0;
    local_a10.xo_value.d.size = 0;
  }
  else {
    QVar31.m_data = (storage_type *)0xa;
    QVar31.m_size = (qsizetype)&local_a10;
    QString::fromUtf8(QVar31);
    local_a10.xo_text.d.size = (qsizetype)local_a10.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_a10._4_4_,local_a10.xo_type);
    local_a10.xo_type = tAttribute;
    local_a10.xo_text.d.ptr = (char16_t *)local_a10.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a10.xo_value.d.d = *(Data **)((long)__buf + 0x1b0);
    local_a10.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x1b8);
    local_a10.xo_value.d.size = *(qsizetype *)((long)__buf + 0x1c0);
    if (&(local_a10.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a10.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a10.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_a10.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_a10);
  if (*(long *)((long)__buf + 0x1d8) == 0) {
    local_a48.xo_type = tNothing;
    local_a48.xo_text.d.d = (Data *)0x0;
    local_a48.xo_text.d.ptr = (char16_t *)0x0;
    local_a48.xo_text.d.size = 0;
    local_a48.xo_value.d.d = (Data *)0x0;
    local_a48.xo_value.d.ptr = (char16_t *)0x0;
    local_a48.xo_value.d.size = 0;
  }
  else {
    QVar32.m_data = (storage_type *)0x15;
    QVar32.m_size = (qsizetype)&local_a48;
    QString::fromUtf8(QVar32);
    local_a48.xo_text.d.size = (qsizetype)local_a48.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_a48._4_4_,local_a48.xo_type);
    local_a48.xo_type = tAttribute;
    local_a48.xo_text.d.ptr = (char16_t *)local_a48.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a48.xo_value.d.d = *(Data **)((long)__buf + 0x1c8);
    local_a48.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x1d0);
    local_a48.xo_value.d.size = *(qsizetype *)((long)__buf + 0x1d8);
    if (&(local_a48.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a48.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a48.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_a48.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_a48);
  if (*(long *)((long)__buf + 0x1f0) == 0) {
    local_a80.xo_type = tNothing;
    local_a80.xo_text.d.d = (Data *)0x0;
    local_a80.xo_text.d.ptr = (char16_t *)0x0;
    local_a80.xo_text.d.size = 0;
    local_a80.xo_value.d.d = (Data *)0x0;
    local_a80.xo_value.d.ptr = (char16_t *)0x0;
    local_a80.xo_value.d.size = 0;
  }
  else {
    QVar33.m_data = (storage_type *)0x18;
    QVar33.m_size = (qsizetype)&local_a80;
    QString::fromUtf8(QVar33);
    local_a80.xo_text.d.size = (qsizetype)local_a80.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_a80._4_4_,local_a80.xo_type);
    local_a80.xo_type = tAttribute;
    local_a80.xo_text.d.ptr = (char16_t *)local_a80.xo_text.d.d;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a80.xo_value.d.d = *(Data **)((long)__buf + 0x1e0);
    local_a80.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x1e8);
    local_a80.xo_value.d.size = *(qsizetype *)((long)__buf + 0x1f0);
    if (&(local_a80.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a80.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a80.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_a80.xo_text.d.d = (Data *)pQVar3;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_a80);
  __return_storage_ptr__ = &local_ab8;
  attrX(__return_storage_ptr__,"PreprocessorDefinitions",(QStringList *)((long)__buf + 0x1f8),",");
  pXVar8 = XmlOutput::operator<<(pXVar8,__return_storage_ptr__);
  lVar2 = *(long *)((long)__buf + 0x218);
  if (lVar2 == 0) {
    local_af0.xo_type = tNothing;
    local_af0.xo_text.d.d = (Data *)0x0;
    local_af0.xo_text.d.ptr = (char16_t *)0x0;
    local_af0.xo_text.d.size = 0;
    local_af0.xo_value.d.d = (Data *)0x0;
    local_af0.xo_value.d.ptr = (char16_t *)0x0;
    local_af0.xo_value.d.size = 0;
  }
  else {
    QVar34.m_data = (storage_type *)0x17;
    QVar34.m_size = (qsizetype)&local_af0;
    QString::fromUtf8(QVar34);
    local_af0.xo_text.d.size = (qsizetype)local_af0.xo_text.d.ptr;
    __return_storage_ptr__ = (xml_output *)CONCAT44(local_af0._4_4_,local_af0.xo_type);
    local_af0.xo_type = tAttribute;
    local_af0.xo_text.d.ptr = (char16_t *)local_af0.xo_text.d.d;
    if (__return_storage_ptr__ != (xml_output *)0x0) {
      LOCK();
      __return_storage_ptr__->xo_type = __return_storage_ptr__->xo_type + tRaw;
      UNLOCK();
    }
    local_af0.xo_value.d.d = *(Data **)((long)__buf + 0x210);
    local_af0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x218);
    local_af0.xo_value.d.size = *(qsizetype *)((long)__buf + 0x220);
    local_af0.xo_text.d.d = (Data *)__return_storage_ptr__;
    if (&(local_af0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_af0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_af0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_af0);
  iVar1 = *(int *)((long)__buf + 0x228);
  if (iVar1 == -1) {
    local_b28.xo_type = tNothing;
    local_b28.xo_text.d.d = (Data *)0x0;
    local_b28.xo_text.d.ptr = (char16_t *)0x0;
    local_b28.xo_text.d.size = 0;
    local_b28.xo_value.d.d = (Data *)0x0;
    local_b28.xo_value.d.ptr = (char16_t *)0x0;
    local_b28.xo_value.d.size = 0;
  }
  else {
    QVar35.m_data = (storage_type *)0xe;
    QVar35.m_size = (qsizetype)&local_b28;
    QString::fromUtf8(QVar35);
    pcVar7 = local_b28.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_b28._4_4_,local_b28.xo_type);
    QString::number((int)&local_b60,iVar1);
    local_b28.xo_type = tAttribute;
    local_b28.xo_text.d.ptr = (char16_t *)local_b28.xo_text.d.d;
    local_b28.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b28.xo_value.d.d = (Data *)local_b60._0_8_;
    local_b28.xo_value.d.ptr = (char16_t *)local_b60.xo_text.d.d;
    local_b28.xo_value.d.size = (qsizetype)local_b60.xo_text.d.ptr;
    local_b28.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_b60._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b60._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b60._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QBasicAtomicInt *)local_b60._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b60._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b60._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b60._0_8_,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_b28);
  attrT(&local_b60,"RuntimeTypeInfo",*(triState *)((long)__buf + 0x22c));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_b60);
  attrT(&local_b98,"ShowIncludes",*(triState *)((long)__buf + 0x230));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_b98);
  attrT(&local_bd0,"SmallerTypeCheck",*(triState *)((long)__buf + 0x234));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_bd0);
  attrT(&local_c08,"StringPooling",*(triState *)((long)__buf + 0x238));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_c08);
  iVar1 = *(int *)((long)__buf + 0x23c);
  if (iVar1 == 0) {
    local_c40.xo_type = tNothing;
    local_c40.xo_text.d.d = (Data *)0x0;
    local_c40.xo_text.d.ptr = (char16_t *)0x0;
    local_c40.xo_text.d.size = 0;
    local_c40.xo_value.d.d = (Data *)0x0;
    local_c40.xo_value.d.ptr = (char16_t *)0x0;
    local_c40.xo_value.d.size = 0;
  }
  else {
    QVar36.m_data = (storage_type *)0x15;
    QVar36.m_size = (qsizetype)&local_c40;
    QString::fromUtf8(QVar36);
    pcVar7 = local_c40.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_c40._4_4_,local_c40.xo_type);
    QString::number((int)&local_c78,iVar1);
    local_c40.xo_type = tAttribute;
    local_c40.xo_text.d.ptr = (char16_t *)local_c40.xo_text.d.d;
    local_c40.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_c40.xo_value.d.d = (Data *)local_c78._0_8_;
    local_c40.xo_value.d.ptr = (char16_t *)local_c78.xo_text.d.d;
    local_c40.xo_value.d.size = (qsizetype)local_c78.xo_text.d.ptr;
    local_c40.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_c78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_c78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_c78._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QBasicAtomicInt *)local_c78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_c78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_c78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_c78._0_8_,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_c40);
  attrT(&local_c78,"SuppressStartupBanner",*(triState *)((long)__buf + 0x240));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_c78);
  attrT(&local_cb0,"TreatWChar_tAsBuiltInType",*(triState *)((long)__buf + 0x244));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_cb0);
  attrT(&local_ce8,"TurnOffAssemblyGeneration",*(triState *)((long)__buf + 0x248));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_ce8);
  attrT(&local_d20,"UndefineAllPreprocessorDefinitions",*(triState *)((long)__buf + 0x24c));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_d20);
  attrX(&local_d58,"UndefinePreprocessorDefinitions",(QStringList *)((long)__buf + 0x250),",");
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_d58);
  iVar1 = *(int *)((long)__buf + 0x268);
  iVar9 = 0;
  if (iVar1 != 2) {
    iVar9 = iVar1;
  }
  iVar10 = 2;
  if (iVar9 != 3) {
    iVar10 = iVar9;
  }
  if (*(int *)(*(long *)((long)__buf + 0x318) + 4) < 0x80) {
    iVar10 = iVar1;
  }
  if (iVar10 == -1) {
    local_d90.xo_type = tNothing;
    local_d90.xo_text.d.d = (Data *)0x0;
    local_d90.xo_text.d.ptr = (char16_t *)0x0;
    local_d90.xo_text.d.size = 0;
    local_d90.xo_value.d.d = (Data *)0x0;
    local_d90.xo_value.d.ptr = (char16_t *)0x0;
    local_d90.xo_value.d.size = 0;
  }
  else {
    QVar37.m_data = (storage_type *)0x14;
    QVar37.m_size = (qsizetype)&local_d90;
    QString::fromUtf8(QVar37);
    pcVar7 = local_d90.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_d90._4_4_,local_d90.xo_type);
    QString::number((int)&local_dc8,iVar10);
    local_d90.xo_type = tAttribute;
    local_d90.xo_text.d.ptr = (char16_t *)local_d90.xo_text.d.d;
    local_d90.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_d90.xo_value.d.d = (Data *)local_dc8._0_8_;
    local_d90.xo_value.d.ptr = (char16_t *)local_dc8.xo_text.d.d;
    local_d90.xo_value.d.size = (qsizetype)local_dc8.xo_text.d.ptr;
    local_d90.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_dc8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_dc8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_dc8._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QBasicAtomicInt *)local_dc8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_dc8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_dc8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_dc8._0_8_,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_d90);
  attrT(&local_dc8,"WarnAsError",*(triState *)((long)__buf + 0x288));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_dc8);
  iVar1 = *(int *)((long)__buf + 0x28c);
  if (iVar1 == -1) {
    local_e00.xo_type = tNothing;
    local_e00.xo_text.d.d = (Data *)0x0;
    local_e00.xo_text.d.ptr = (char16_t *)0x0;
    local_e00.xo_text.d.size = 0;
    local_e00.xo_value.d.d = (Data *)0x0;
    local_e00.xo_value.d.ptr = (char16_t *)0x0;
    local_e00.xo_value.d.size = 0;
  }
  else {
    QVar38.m_data = &DAT_0000000c;
    QVar38.m_size = (qsizetype)&local_e00;
    QString::fromUtf8(QVar38);
    pcVar7 = local_e00.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_e00._4_4_,local_e00.xo_type);
    QString::number((int)&local_e38,iVar1);
    local_e00.xo_type = tAttribute;
    local_e00.xo_text.d.ptr = (char16_t *)local_e00.xo_text.d.d;
    local_e00.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e00.xo_value.d.d = (Data *)local_e38._0_8_;
    local_e00.xo_value.d.ptr = (char16_t *)local_e38.xo_text.d.d;
    local_e00.xo_value.d.size = (qsizetype)local_e38.xo_text.d.ptr;
    local_e00.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_e38._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e38._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e38._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QBasicAtomicInt *)local_e38._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e38._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e38._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e38._0_8_,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_e00);
  attrT(&local_e38,"WholeProgramOptimization",*(triState *)((long)__buf + 0x290));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_e38);
  iVar1 = *(int *)((long)__buf + 0x294);
  if (iVar1 == -1) {
    local_e70.xo_type = tNothing;
    local_e70.xo_text.d.d = (Data *)0x0;
    local_e70.xo_text.d.ptr = (char16_t *)0x0;
    local_e70.xo_text.d.size = 0;
    local_e70.xo_value.d.d = (Data *)0x0;
    local_e70.xo_value.d.ptr = (char16_t *)0x0;
    local_e70.xo_value.d.size = 0;
  }
  else {
    QVar39.m_data = (storage_type *)0x16;
    QVar39.m_size = (qsizetype)&local_e70;
    QString::fromUtf8(QVar39);
    pcVar7 = local_e70.xo_text.d.ptr;
    pQVar3 = (QArrayData *)CONCAT44(local_e70._4_4_,local_e70.xo_type);
    QString::number((int)&local_ea8,iVar1);
    local_e70.xo_type = tAttribute;
    local_e70.xo_text.d.ptr = (char16_t *)local_e70.xo_text.d.d;
    local_e70.xo_text.d.size = (qsizetype)pcVar7;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_e70.xo_value.d.d = (Data *)local_ea8._0_8_;
    local_e70.xo_value.d.ptr = (char16_t *)local_ea8.xo_text.d.d;
    local_e70.xo_value.d.size = (qsizetype)local_ea8.xo_text.d.ptr;
    local_e70.xo_text.d.d = (Data *)pQVar3;
    if ((QArrayData *)local_ea8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_ea8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_ea8._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (((QBasicAtomicInt *)local_ea8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_ea8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_ea8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_ea8._0_8_,2,0x10);
      }
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_e70);
  attrT(&local_ea8,"InterworkCalls",*(triState *)((long)__buf + 0x298));
  pXVar8 = XmlOutput::operator<<(pXVar8,&local_ea8);
  QVar40.m_data = (storage_type *)0x4;
  QVar40.m_size = (qsizetype)&local_ee0;
  QString::fromUtf8(QVar40);
  local_ee0.xo_text.d.size = (qsizetype)local_ee0.xo_text.d.ptr;
  pQVar3 = (QArrayData *)CONCAT44(local_ee0._4_4_,local_ee0.xo_type);
  local_ee0.xo_type = tCloseTag;
  local_ee0.xo_text.d.ptr = (char16_t *)local_ee0.xo_text.d.d;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_ee0.xo_value.d.d = (Data *)0x0;
  local_ee0.xo_value.d.ptr = (char16_t *)0x0;
  local_ee0.xo_value.d.size = 0;
  local_ee0.xo_text.d.d = (Data *)pQVar3;
  XmlOutput::operator<<(pXVar8,&local_ee0);
  if (&(local_ee0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ee0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ee0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ee0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_ee0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_ee0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ee0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ee0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ee0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_ee0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if (&(local_ea8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ea8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ea8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ea8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_ea8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_ea8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ea8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ea8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ea8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_ea8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e70.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_e70.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e70.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e70.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e38.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e38.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e38.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e38.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_e38.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e38.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e38.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e38.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e38.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e38.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e00.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e00.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e00.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e00.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_e00.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e00.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e00.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e00.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e00.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e00.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_dc8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_dc8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_dc8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_dc8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_dc8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_dc8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_dc8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_dc8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_dc8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_dc8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d90.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d90.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_d90.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d90.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d90.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d90.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d58.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d58.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d58.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d58.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_d58.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d58.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d58.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d58.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d58.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d58.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d20.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d20.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d20.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d20.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_d20.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d20.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d20.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d20.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d20.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d20.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_ce8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ce8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ce8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ce8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_ce8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_ce8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ce8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ce8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ce8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_ce8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_cb0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_cb0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_cb0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_cb0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_cb0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_cb0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_cb0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_cb0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_cb0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_cb0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_c78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_c78.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_c78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_c78.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c40.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c40.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c40.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_c40.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_c40.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c40.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c40.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c40.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_c40.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_c40.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c08.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_c08.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_c08.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c08.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_c08.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_c08.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_bd0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_bd0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_bd0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_bd0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_bd0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_bd0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_bd0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_bd0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_bd0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_bd0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b98.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b98.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b98.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b98.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_b98.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b98.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b98.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b98.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b98.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b98.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b60.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b60.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b60.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b60.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_b60.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b60.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b60.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b60.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b60.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b60.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b28.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b28.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_b28.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b28.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b28.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b28.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_af0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_af0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_af0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_af0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_af0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((xml_output *)local_af0.xo_text.d.d != (xml_output *)0x0) {
    LOCK();
    *(XMLType *)&(local_af0.xo_text.d.d)->super_QArrayData =
         *(XMLType *)&(local_af0.xo_text.d.d)->super_QArrayData - tRaw;
    UNLOCK();
    if (*(XMLType *)&(local_af0.xo_text.d.d)->super_QArrayData == tNothing) {
      QArrayData::deallocate(&(local_af0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (__return_storage_ptr__ != (xml_output *)0x0 && lVar2 != 0) {
    LOCK();
    __return_storage_ptr__->xo_type = __return_storage_ptr__->xo_type - tRaw;
    UNLOCK();
    if (__return_storage_ptr__->xo_type == tNothing) {
      QArrayData::deallocate((QArrayData *)__return_storage_ptr__,2,0x10);
    }
  }
  if (&(local_ab8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ab8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ab8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ab8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_ab8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_ab8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_ab8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_ab8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_ab8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_ab8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a80.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a80.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a80.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a80.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_a80.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a80.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a80.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a80.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a80.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a80.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a48.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a48.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a48.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a48.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_a48.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a48.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a48.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a48.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a48.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a48.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a10.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a10.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a10.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a10.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_a10.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a10.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a10.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a10.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a10.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a10.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_9d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_9d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_9d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_9d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_9d8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_9d8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_9d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_9d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_9d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_9d8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_9a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_9a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_9a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_9a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_9a0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_9a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_9a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_9a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_9a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_9a0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_968.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_968.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_968.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_968.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_968.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_968.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_968.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_968.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_968.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_968.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_930.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_930.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_930.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_930.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_930.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_930.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_930.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_930.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_930.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_930.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_8f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_8f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_8f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_8f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_8f8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_8f8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_8f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_8f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_8f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_8f8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_8c0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_8c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_8c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_8c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_8c0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_8c0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_8c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_8c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_8c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_8c0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_888.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_888.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_888.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_888.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_888.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_888.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_888.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_888.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_888.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_888.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_850.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_850.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_850.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_850.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_850.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_850.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_850.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_850.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_850.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_850.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_818.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_818.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_818.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_818.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_818.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_818.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_818.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_818.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_818.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_818.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_7e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_7e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_7e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_7e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_7e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_7e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_7e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_7e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_7e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_7e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_7a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_7a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_7a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_7a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_7a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_7a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_7a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_7a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_7a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_7a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_770.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_770.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_770.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_770.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_770.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_770.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_770.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_770.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_770.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_770.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_738.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_738.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_738.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_738.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_738.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_738.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_738.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_738.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_738.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_738.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_700.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_700.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_700.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_700.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_700.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_700.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_700.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_700.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_700.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_700.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6c8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6c8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_6c8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_6c8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_6c8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_6c8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_690.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_690.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_690.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_690.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_690.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_690.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_690.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_690.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_690.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_690.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_658.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_658.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_658.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_658.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_658.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_658.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_658.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_658.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_658.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_658.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_620.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_620.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_620.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_620.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_620.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_620.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_620.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_620.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_620.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_620.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_5e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_5e8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_5e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_5e8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_5b0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_5b0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_5b0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_5b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_5b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_5b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_5b0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_578.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_578.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_578.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_578.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_578.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_578.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_578.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_578.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_578.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_578.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_540.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_540.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_540.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_540.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_540.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_540.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_540.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_540.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_540.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_540.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_508.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_508.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_508.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_508.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_508.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_508.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_508.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_508.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_508.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_508.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_4d0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_4d0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_4d0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_4d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_4d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_4d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_4d0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_498.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_498.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_498.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_498.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_498.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_498.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_498.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_498.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_498.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_498.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_460.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_460.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_460.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_460.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_460.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_460.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_460.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_460.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_460.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_460.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_428.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_428.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_428.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_428.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_428.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_428.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_428.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_428.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_428.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_428.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_3f0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_3f0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_3b8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_3b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_3b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_3b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_3b8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_380.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_380.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_380.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_380.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_380.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_380.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_348.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_348.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_348.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_348.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_348.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_348.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_310.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_310.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_310.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_310.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_310.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_310.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2d8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2d8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2d8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2d8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2d8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2a0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2a0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2a0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2a0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_268.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_268.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_268.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_268.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_268.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_230.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_230.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_230.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1f8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1f8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1f8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1f8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1c0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1c0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1c0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1c0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1c0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_188.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_188.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_188.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_188.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_150.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_150.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_150.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_150.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_150.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_118.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_e0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_e0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_e0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_a8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_a8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_a8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  if (&(local_70.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_70.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_70.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_70.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_70.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCCLCompilerTool &tool)
{
    xml << tag(_Tool)
        << attrS(_Name, _VCCLCompilerTool)
        << attrX(_AdditionalIncludeDirectories, tool.AdditionalIncludeDirectories)
        << attrX(_AdditionalOptions, tool.AdditionalOptions, " ")
        << attrX(_AdditionalUsingDirectories, tool.AdditionalUsingDirectories)
        << attrS(_AssemblerListingLocation, tool.AssemblerListingLocation)
        << attrE(_AssemblerOutput, tool.AssemblerOutput, /*ifNot*/ asmListingNone)
        << attrE(_BasicRuntimeChecks, tool.BasicRuntimeChecks, /*ifNot*/ runtimeBasicCheckNone)
        << attrE(_BrowseInformation, tool.BrowseInformation, /*ifNot*/ brInfoNone)
        << attrS(_BrowseInformationFile, tool.BrowseInformationFile)
        << attrT(_BufferSecurityCheck, tool.BufferSecurityCheck)
        << attrE(_CallingConvention, tool.CallingConvention, /*ifNot*/ callConventionDefault)
        << attrE(_CompileAs, tool.CompileAs, compileAsDefault)
        << attrE(_CompileAsManaged, tool.CompileAsManaged, /*ifNot*/ managedDefault)
        << attrT(_CompileOnly, tool.CompileOnly)
        << attrE(_DebugInformationFormat, tool.DebugInformationFormat, /*ifNot*/ debugUnknown)
        << attrT(_Detect64BitPortabilityProblems, tool.Detect64BitPortabilityProblems)
        << attrT(_DisableLanguageExtensions, tool.DisableLanguageExtensions)
        << attrX(_DisableSpecificWarnings, tool.DisableSpecificWarnings)
        << attrE(_EnableEnhancedInstructionSet, tool.EnableEnhancedInstructionSet, /*ifnot*/ archNotSet)
        << attrT(_EnableFiberSafeOptimizations, tool.EnableFiberSafeOptimizations)
        << attrT(_EnableFunctionLevelLinking, tool.EnableFunctionLevelLinking)
        << attrT(_EnableIntrinsicFunctions, tool.EnableIntrinsicFunctions)
        << xformExceptionHandlingNET2005(tool.ExceptionHandling, tool.config->CompilerVersion)
        << attrT(_ExpandAttributedSource, tool.ExpandAttributedSource)
        << attrE(_FavorSizeOrSpeed, tool.FavorSizeOrSpeed, /*ifNot*/ favorNone)

        << attrE(_FloatingPointModel, tool.FloatingPointModel, /*ifNot*/ floatingPointNotSet)
        << attrT(_FloatingPointExceptions, tool.FloatingPointExceptions)

        << attrT(_ForceConformanceInForLoopScope, tool.ForceConformanceInForLoopScope)
        << attrX(_ForcedIncludeFiles, tool.ForcedIncludeFiles)
        << attrX(_ForcedUsingFiles, tool.ForcedUsingFiles)
        << attrE(_GeneratePreprocessedFile, tool.GeneratePreprocessedFile, /*ifNot*/ preprocessUnknown)
        << attrT(_GlobalOptimizations, tool.GlobalOptimizations)
        << attrT(_IgnoreStandardIncludePath, tool.IgnoreStandardIncludePath)
        << attrT(_ImproveFloatingPointConsistency, tool.ImproveFloatingPointConsistency)
        << attrE(_InlineFunctionExpansion, tool.InlineFunctionExpansion, /*ifNot*/ expandDefault)
        << attrT(_KeepComments, tool.KeepComments)
        << attrT(_MinimalRebuild, tool.MinimalRebuild)
        << attrS(_ObjectFile, tool.ObjectFile)
        << attrT(_OmitFramePointers, tool.OmitFramePointers)
        << attrT(_OpenMP, tool.OpenMP)
        << attrE(_Optimization, tool.Optimization, /*ifNot*/ optimizeDefault)
        << attrE(_OptimizeForProcessor, tool.OptimizeForProcessor, /*ifNot*/ procOptimizeBlended)
        << attrT(_OptimizeForWindowsApplication, tool.OptimizeForWindowsApplication)
        << attrS(_OutputFile, tool.OutputFile)
        << attrS(_PrecompiledHeaderFile, tool.PrecompiledHeaderFile)
        << attrS(_PrecompiledHeaderThrough, tool.PrecompiledHeaderThrough)
        << attrX(_PreprocessorDefinitions, tool.PreprocessorDefinitions)
        << (tool.ProgramDataBaseFileName.isNull() ? noxml() : attr(_ProgramDataBaseFileName, tool.ProgramDataBaseFileName))
        << attrE(_RuntimeLibrary, tool.RuntimeLibrary, /*ifNot*/ rtUnknown)
        << attrT(_RuntimeTypeInfo, tool.RuntimeTypeInfo)
        << attrT(_ShowIncludes, tool.ShowIncludes)
        << attrT(_SmallerTypeCheck, tool.SmallerTypeCheck)
        << attrT(_StringPooling, tool.StringPooling)
        << attrE(_StructMemberAlignment, tool.StructMemberAlignment, /*ifNot*/ alignNotSet)
        << attrT(_SuppressStartupBanner, tool.SuppressStartupBanner)
        << attrT(_TreatWChar_tAsBuiltInType, tool.TreatWChar_tAsBuiltInType)
        << attrT(_TurnOffAssemblyGeneration, tool.TurnOffAssemblyGeneration)
        << attrT(_UndefineAllPreprocessorDefinitions, tool.UndefineAllPreprocessorDefinitions)
        << attrX(_UndefinePreprocessorDefinitions, tool.UndefinePreprocessorDefinitions)
        << xformUsePrecompiledHeaderForNET2005(tool.UsePrecompiledHeader, tool.config->CompilerVersion)
        << attrT(_WarnAsError, tool.WarnAsError)
        << attrE(_WarningLevel, tool.WarningLevel, /*ifNot*/ warningLevelUnknown)
        << attrT(_WholeProgramOptimization, tool.WholeProgramOptimization)
        << attrE(_CompileForArchitecture, tool.CompileForArchitecture, /*ifNot*/ archUnknown)
        << attrT(_InterworkCalls, tool.InterworkCalls)

        << closetag(_Tool);
}